

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::validateKTXwriterScParams
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  bool bVar1;
  uint8_t *in_RCX;
  bool bVar2;
  optional<unsigned_long> invalidIndex;
  uint8_t *local_38;
  char local_30;
  
  this->foundKTXwriterScParams = true;
  if (size == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = data[size - 1] == '\0';
  }
  if (bVar2 == false) {
    error<>(this,&Metadata::KTXwriterScParamsMissingNull);
  }
  local_38 = data;
  do {
    if (local_38 == data + (size - bVar2)) {
      local_30 = '\0';
      goto LAB_001af880;
    }
    bVar1 = advanceUTF8<char_const*>((char **)&local_38,(char *)(data + (size - bVar2)));
  } while (bVar1);
  in_RCX = local_38 + -(long)data;
  local_30 = '\x01';
LAB_001af880:
  if (local_30 != '\0') {
    local_38 = in_RCX;
    error<unsigned_long&>(this,&Metadata::KTXwriterScParamsInvalidUTF8,(unsigned_long *)&local_38);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXwriterScParams(const uint8_t* data, uint32_t size) {
    foundKTXwriterScParams = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXwriterScParamsMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);
    if (auto invalidIndex = validateUTF8(value))
        error(Metadata::KTXwriterScParamsInvalidUTF8, *invalidIndex);
}